

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrbtree.c
# Opt level: O1

xrbt_iter_t xrbt_find(xrbt_t *tr,void *pdata)

{
  xrbt_iter_t pxVar1;
  int iVar2;
  long lVar3;
  
  pxVar1 = tr->root;
  while( true ) {
    if (pxVar1 == (xrbt_iter_t)0x0) {
      return (xrbt_iter_t)0x0;
    }
    iVar2 = (*tr->compare_cb)(pxVar1 + 1,pdata);
    lVar3 = 8;
    if ((iVar2 < 1) && (lVar3 = 0x10, -1 < iVar2)) break;
    pxVar1 = *(xrbt_iter_t *)((long)&pxVar1->rb_parent_color + lVar3);
  }
  return pxVar1;
}

Assistant:

xrbt_iter_t xrbt_find(xrbt_t* tr, const void* pdata)
{
    xrbt_iter_t iter = tr->root;
    int result;

    while (iter)
    {
        result = tr->compare_cb(xrbt_iter_data(iter), (void*)pdata);

        if (result > 0)
            iter = iter->rb_right;
        else if (result < 0)
            iter = iter->rb_left;
        else
            return iter;
    }

    return NULL;
}